

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

FieldDescriptor * __thiscall
google::protobuf::Message::_InternalParse::ReflectiveFieldParser::Field
          (ReflectiveFieldParser *this,int num,int wire_type)

{
  DescriptorPool *this_00;
  bool bVar1;
  Type TVar2;
  FieldDescriptor *this_01;
  
  this_01 = Descriptor::FindFieldByNumber(this->descriptor_,num);
  if (this_01 == (FieldDescriptor *)0x0) {
    bVar1 = Descriptor::IsExtensionNumber(this->descriptor_,num);
    if (bVar1) {
      this_00 = (this->ctx_->data_).pool;
      if (this_00 == (DescriptorPool *)0x0) {
        this_01 = Reflection::FindKnownExtensionByNumber(this->reflection_,num);
      }
      else {
        this_01 = DescriptorPool::FindExtensionByNumber(this_00,this->descriptor_,num);
      }
      if (this_01 != (FieldDescriptor *)0x0) goto LAB_00269f6b;
    }
    this_01 = (FieldDescriptor *)0x0;
  }
  else {
LAB_00269f6b:
    TVar2 = FieldDescriptor::type(this_01);
    if (*(int *)(internal::WireFormatLite::kWireTypeForFieldType + (ulong)TVar2 * 4) != wire_type) {
      bVar1 = FieldDescriptor::is_packable(this_01);
      if (!bVar1) {
        this_01 = (FieldDescriptor *)0x0;
      }
      if (wire_type != 2) {
        this_01 = (FieldDescriptor *)0x0;
      }
    }
  }
  return this_01;
}

Assistant:

const FieldDescriptor* Field(int num, int wire_type) {
      auto field = descriptor_->FindFieldByNumber(num);

      // If that failed, check if the field is an extension.
      if (field == nullptr && descriptor_->IsExtensionNumber(num)) {
        const DescriptorPool* pool = ctx_->data().pool;
        if (pool == NULL) {
          field = reflection_->FindKnownExtensionByNumber(num);
        } else {
          field = pool->FindExtensionByNumber(descriptor_, num);
        }
      }
      if (field == nullptr) return nullptr;

      if (internal::WireFormat::WireTypeForFieldType(field->type()) !=
          wire_type) {
        if (field->is_packable()) {
          if (wire_type ==
              internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
            return field;
          }
        }
        return nullptr;
      }
      return field;
    }